

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSat.c
# Opt level: O1

DdNode * Cudd_Decreasing(DdManager *dd,DdNode *f,int i)

{
  uint uVar1;
  DdNode *pDVar2;
  DdNode *f_00;
  int iVar3;
  DdNode *pDVar4;
  DdNode *f_01;
  DdNode *pDVar5;
  uint uVar6;
  
  pDVar5 = (DdNode *)((ulong)f & 0xfffffffffffffffe);
  uVar6 = 0x7fffffff;
  if ((ulong)pDVar5->index != 0x7fffffff) {
    uVar6 = dd->perm[pDVar5->index];
  }
  uVar1 = dd->perm[i];
  if (uVar1 < uVar6) {
    pDVar4 = dd->one;
  }
  else {
    pDVar4 = cuddCacheLookup2(dd,Cudd_Decreasing,f,dd->vars[i]);
    if (pDVar4 == (DdNode *)0x0) {
      pDVar4 = (pDVar5->type).kids.T;
      pDVar2 = (pDVar5->type).kids.E;
      f_01 = (DdNode *)((ulong)pDVar2 ^ 1);
      f_00 = (DdNode *)((ulong)pDVar4 ^ 1);
      if (pDVar5 == f) {
        f_01 = pDVar2;
        f_00 = pDVar4;
      }
      if (uVar6 == uVar1) {
        if ((((ulong)f_00 & 1) == 0) && (((ulong)f_01 & 1) != 0)) {
          return (DdNode *)((ulong)dd->one ^ 1);
        }
        iVar3 = Cudd_bddLeq(dd,f_00,f_01);
        pDVar4 = dd->one;
        if (iVar3 == 0) {
          pDVar4 = (DdNode *)((ulong)pDVar4 ^ 1);
        }
      }
      else {
        pDVar4 = Cudd_Decreasing(dd,f_00,i);
        if (pDVar4 == dd->one) {
          pDVar4 = Cudd_Decreasing(dd,f_01,i);
        }
      }
      cuddCacheInsert2(dd,Cudd_Decreasing,f,dd->vars[i],pDVar4);
    }
  }
  return pDVar4;
}

Assistant:

DdNode *
Cudd_Decreasing(
  DdManager * dd,
  DdNode * f,
  int  i)
{
    unsigned int topf, level;
    DdNode *F, *fv, *fvn, *res;
    DD_CTFP cacheOp;

    statLine(dd);
#ifdef DD_DEBUG
    assert(0 <= i && i < dd->size);
#endif

    F = Cudd_Regular(f);
    topf = cuddI(dd,F->index);

    /* Check terminal case. If topf > i, f does not depend on var.
    ** Therefore, f is unate in i.
    */
    level = (unsigned) dd->perm[i];
    if (topf > level) {
        return(DD_ONE(dd));
    }

    /* From now on, f is not constant. */

    /* Check cache. */
    cacheOp = (DD_CTFP) Cudd_Decreasing;
    res = cuddCacheLookup2(dd,cacheOp,f,dd->vars[i]);
    if (res != NULL) {
        return(res);
    }

    /* Compute cofactors. */
    fv = cuddT(F); fvn = cuddE(F);
    if (F != f) {
        fv = Cudd_Not(fv);
        fvn = Cudd_Not(fvn);
    }

    if (topf == (unsigned) level) {
        /* Special case: if fv is regular, fv(1,...,1) = 1;
        ** If in addition fvn is complemented, fvn(1,...,1) = 0.
        ** But then f(1,1,...,1) > f(0,1,...,1). Hence f is not
        ** monotonic decreasing in i.
        */
        if (!Cudd_IsComplement(fv) && Cudd_IsComplement(fvn)) {
            return(Cudd_Not(DD_ONE(dd)));
        }
        res = Cudd_bddLeq(dd,fv,fvn) ? DD_ONE(dd) : Cudd_Not(DD_ONE(dd));
    } else {
        res = Cudd_Decreasing(dd,fv,i);
        if (res == DD_ONE(dd)) {
            res = Cudd_Decreasing(dd,fvn,i);
        }
    }

    cuddCacheInsert2(dd,cacheOp,f,dd->vars[i],res);
    return(res);

}